

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::start_note(Renderer *this,int chan,int note,int vel)

{
  BYTE BVar1;
  uint note_00;
  Renderer *pRVar2;
  Sample *sp;
  Sample *pSVar3;
  Instrument *pIVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  float f;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar5 = this->channel[chan].bank;
  note_00 = note & 0x7f;
  pRVar2 = this;
  if (((uint)this->drumchannels >> (chan & 0x1fU) & 1) == 0) {
    iVar6 = this->channel[chan].program;
    if (iVar6 == -1) {
      pIVar4 = this->default_instrument;
    }
    else if ((((&tonebank)[iVar5] == 0) ||
             (pIVar4 = *(Instrument **)((&tonebank)[iVar5] + 8 + (long)iVar6 * 8),
             pIVar4 == (Instrument *)0x0)) &&
            (pIVar4 = *(Instrument **)(tonebank + 8 + (long)iVar6 * 8), pIVar4 == (Instrument *)0x0)
            ) {
      return;
    }
    if (pIVar4 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/playmidi.cpp"
                    ,0x175,"void Timidity::Renderer::start_note(int, int, int)");
    }
  }
  else {
    if ((((&drumset)[iVar5] == 0) ||
        (pIVar4 = *(Instrument **)((&drumset)[iVar5] + 8 + (ulong)note_00 * 8),
        pIVar4 == (Instrument *)0x0)) &&
       (pIVar4 = *(Instrument **)(drumset + 8 + (ulong)note_00 * 8), pIVar4 == (Instrument *)0x0)) {
      return;
    }
    if (pIVar4 == (Instrument *)0xffffffffffffffff) {
      __assert_fail("ip != MAGIC_LOAD_INSTRUMENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/timidity/playmidi.cpp"
                    ,0x15f,"void Timidity::Renderer::start_note(int, int, int)");
    }
    if ((pIVar4->samples != 1) && (pIVar4->sample->type == '\0')) {
      pRVar2 = (Renderer *)0x1;
      cmsg(1,1,"Strange: percussion instrument with %d samples!");
    }
  }
  sp = pIVar4->sample;
  if ((sp == (Sample *)0x0) || (iVar5 = pIVar4->samples, iVar5 == 0)) {
    return;
  }
  BVar1 = sp->type;
  if ((BVar1 == '\0') && (sp->scale_factor != 0x400)) {
    f = calculate_scaled_frequency(pRVar2,sp,note_00);
  }
  else {
    dVar8 = exp2((double)note_00 * 0.08333333333333333);
    f = (float)(dVar8 * 8175.798947309669);
    if (BVar1 != '\0') {
      while( true ) {
        bVar7 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar7) {
          return;
        }
        if (((((int)(uint)sp->low_vel <= vel) && ((uint)vel <= (uint)sp->high_vel)) &&
            (sp->low_freq <= f)) &&
           ((f < sp->high_freq || f == sp->high_freq &&
            (bVar7 = start_region(this,chan,note_00,vel,sp,f), !bVar7)))) break;
        sp = sp + 1;
      }
      return;
    }
  }
  iVar6 = iVar5;
  pSVar3 = sp;
  if (iVar5 == 1) {
    start_region(this,chan,note_00,vel,sp,f);
    iVar5 = pIVar4->samples;
    sp = pIVar4->sample;
    iVar6 = iVar5;
    pSVar3 = sp;
  }
  while (iVar5 != 0) {
    if (((sp->low_freq <= f) && (f < sp->high_freq || f == sp->high_freq)) &&
       ((iVar5 < 2 || ((f < sp[1].low_freq || (sp[1].high_freq <= f && f != sp[1].high_freq))))))
    goto LAB_00370c09;
    sp = sp + 1;
    iVar5 = iVar5 + -1;
  }
  dVar9 = log((double)f * 0.00012231220538135425);
  dVar8 = 10000000000.0;
  sp = pSVar3;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    dVar10 = log((double)pSVar3->root_freq * 0.00012231220538135425);
    dVar10 = ABS((dVar10 - dVar9) * 17.312340490667562);
    bVar7 = dVar10 < dVar8;
    if (dVar10 <= dVar8) {
      dVar8 = dVar10;
    }
    if (bVar7) {
      sp = pSVar3;
    }
    pSVar3 = pSVar3 + 1;
  }
LAB_00370c09:
  start_region(this,chan,note_00,vel,sp,f);
  return;
}

Assistant:

void Renderer::start_note(int chan, int note, int vel)
{
	Instrument *ip;
	Sample *sp;
	int bank = channel[chan].bank;
	int prog = channel[chan].program;
	int i;
	float f;

	note &= 0x7f;
	if (ISDRUMCHANNEL(chan))
	{
		if (NULL == drumset[bank] || NULL == (ip = drumset[bank]->instrument[note]))
		{
			if (!(ip = drumset[0]->instrument[note]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
		if (ip->samples != 1 && ip->sample->type == INST_GUS)
		{
			cmsg(CMSG_WARNING, VERB_VERBOSE, 
				"Strange: percussion instrument with %d samples!", ip->samples);
		}
	}
	else
	{
		if (channel[chan].program == SPECIAL_PROGRAM)
		{
			ip = default_instrument;
		}
		else if (NULL == tonebank[bank] || NULL == (ip = tonebank[bank]->instrument[prog]))
		{
			if (NULL == (ip = tonebank[0]->instrument[prog]))
				return; /* No instrument? Then we can't play. */
		}
		assert(ip != MAGIC_LOAD_INSTRUMENT);
		if (ip == MAGIC_LOAD_INSTRUMENT)
		{
			return;
		}
	}

	if (NULL == ip->sample || ip->samples == 0)
		return;	/* No samples? Then nothing to play. */

	// For GF1 patches, scaling is based solely on the first
	// waveform in this layer.
	if (ip->sample->type == INST_GUS && ip->sample->scale_factor != 1024)
	{
		f = calculate_scaled_frequency(ip->sample, note);
	}
	else
	{
		f = note_to_freq(note);
	}

	if (ip->sample->type == INST_GUS)
	{
		/* We're more lenient with matching ranges for GUS patches, since the
		 * official Gravis ones don't cover the full range of possible
		 * frequencies for every instrument.
		 */
		if (ip->samples == 1)
		{ // If there's only one sample, definitely play it.
			start_region(chan, note, vel, ip->sample, f);
		}
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			// GUS patches don't have velocity ranges, so no need to compare against them.
			if (sp->low_freq <= f && sp->high_freq >= f)
			{
				if (i > 1 && (sp + 1)->low_freq <= f && (sp + 1)->high_freq >= f)
				{ /* If there is a range of contiguous regions that match our
				   * desired frequency, the last one in that block is used.
				   */
					continue;
				}
				start_region(chan, note, vel, sp, f);
				break;
			}
		}
		if (i == 0)
		{ /* Found nothing. Try again, but look for the one with the closest root frequency.
		   * As per the suggestion in the original TiMidity function, this search uses
		   * note values rather than raw frequencies.
		   */
			double cdiff = 1e10;
			double want_note = freq_to_note(f);
			Sample *closest = sp = ip->sample;
			for (i = ip->samples; i != 0; --i, ++sp)
			{
				double diff = fabs(freq_to_note(sp->root_freq) - want_note);
				if (diff < cdiff)
				{
					cdiff = diff;
					closest = sp;
				}
			}
			start_region(chan, note, vel, closest, f);
		}
	}
	else
	{
		for (i = ip->samples, sp = ip->sample; i != 0; --i, ++sp)
		{
			if ((sp->low_vel <= vel && sp->high_vel >= vel &&
				 sp->low_freq <= f && sp->high_freq >= f))
			{
				if (!start_region(chan, note, vel, sp, f))
				{ // Ran out of voices
					break;
				}
			}
		}
	}
}